

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLDateTime.cpp
# Opt level: O2

void __thiscall xercesc_4_0::XMLDateTime::normalize(XMLDateTime *this)

{
  int month;
  uint uVar1;
  div_t dVar2;
  int in_EDX;
  int extraout_EDX;
  int extraout_EDX_00;
  int iVar3;
  int in_ESI;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  
  if ((uint)this->fValue[7] < 2) {
    return;
  }
  iVar4 = (uint)(this->fValue[7] != 2) * 2 + -1;
  iVar7 = this->fValue[1];
  month = modulo(iVar7,in_ESI,in_EDX);
  this->fValue[1] = month;
  dVar2 = div(iVar7 + -1,0xc);
  iVar7 = dVar2.quot;
  if (month < 1) {
    month = month + 0xc;
    this->fValue[1] = month;
    iVar7 = iVar7 + -1;
  }
  iVar7 = iVar7 + this->fValue[0];
  this->fValue[0] = iVar7;
  iVar3 = this->fTimeZone[1] * iVar4 + this->fValue[4];
  dVar2 = div(iVar3,0x3c);
  iVar6 = dVar2.quot;
  iVar3 = iVar6 * -0x3c + iVar3;
  this->fValue[4] = iVar3;
  if (iVar3 < 0) {
    this->fValue[4] = iVar3 + 0x3c;
    iVar6 = iVar6 + -1;
  }
  iVar4 = iVar6 + this->fValue[3] + iVar4 * this->fTimeZone[0];
  dVar2 = div(iVar4,0x18);
  iVar3 = dVar2.quot;
  iVar4 = iVar3 * -0x18 + iVar4;
  this->fValue[3] = iVar4;
  if (iVar4 < 0) {
    this->fValue[3] = iVar4 + 0x18;
    iVar3 = iVar3 + -1;
  }
  uVar5 = iVar3 + this->fValue[2];
  this->fValue[2] = uVar5;
  do {
    iVar4 = month;
    uVar1 = maxDayInMonthFor(iVar7,month);
    if ((int)uVar5 < 1) {
      iVar4 = month + -1;
      iVar3 = maxDayInMonthFor(iVar7,iVar4);
      uVar5 = uVar5 + iVar3;
      iVar3 = -1;
      iVar6 = extraout_EDX_00;
    }
    else {
      bVar8 = uVar5 < uVar1;
      uVar5 = uVar5 - uVar1;
      if (bVar8 || uVar5 == 0) {
        this->fValue[7] = 1;
        return;
      }
      iVar3 = 1;
      iVar6 = extraout_EDX;
    }
    this->fValue[2] = uVar5;
    iVar3 = iVar3 + month;
    month = modulo(iVar3,iVar4,iVar6);
    this->fValue[1] = month;
    if (month < 1) {
      month = month + 0xc;
      this->fValue[1] = month;
      iVar7 = iVar7 + -1;
    }
    dVar2 = div(iVar3 + -1,0xc);
    iVar7 = dVar2.quot + iVar7;
    this->fValue[0] = iVar7;
  } while( true );
}

Assistant:

void XMLDateTime::normalize()
{

    if ((fValue[utc] == UTC_UNKNOWN) ||
        (fValue[utc] == UTC_STD)      )
        return;

    int negate = (fValue[utc] == UTC_POS)? -1: 1;
    int temp;
    int carry;


    // we normalize a duration so could have 200M...
    //update months (may be modified additionaly below)
    temp = fValue[Month];
    fValue[Month] = modulo(temp, 1, 13);
    carry = fQuotient(temp, 1, 13);
    if (fValue[Month] <= 0) {
        fValue[Month]+= 12;
        carry--;
    }

    //add years (may be modified additionaly below)
    fValue[CentYear] += carry;

    // add mins
    temp = fValue[Minute] + negate * fTimeZone[mm];
    carry = fQuotient(temp, 60);
    fValue[Minute] = mod(temp, 60, carry);
    if (fValue[Minute] < 0) {
        fValue[Minute] += 60;
        carry--;
    }

    //add hours
    temp = fValue[Hour] + negate * fTimeZone[hh] + carry;
    carry = fQuotient(temp, 24);
    fValue[Hour] = mod(temp, 24, carry);
    if (fValue[Hour] < 0) {
        fValue[Hour] += 24;
        carry--;
    }

    fValue[Day] += carry;

    while (1)
    {
        temp = maxDayInMonthFor(fValue[CentYear], fValue[Month]);
        if (fValue[Day] < 1)
        {
            fValue[Day] += maxDayInMonthFor(fValue[CentYear], fValue[Month] - 1);
            carry = -1;
        }
        else if ( fValue[Day] > temp )
        {
            fValue[Day] -= temp;
            carry = 1;
        }
        else
        {
            break;
        }

        temp = fValue[Month] + carry;
        fValue[Month] = modulo(temp, 1, 13);
        if (fValue[Month] <=0) {
            fValue[Month]+= 12;
            fValue[CentYear]--;
        }
        fValue[CentYear] += fQuotient(temp, 1, 13);
    }

    // set to normalized
    fValue[utc] = UTC_STD;

    return;
}